

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.cpp
# Opt level: O0

void __thiscall RTree::showAll_values_JSON(RTree *this,RTree_node *node,int level,string *json)

{
  pointer *__return_storage_ptr__;
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  vector<Point,_std::allocator<Point>_> local_4d8;
  string local_4c0;
  string local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  vector<Point,_std::allocator<Point>_> local_400;
  int local_3e4;
  undefined1 local_3e0 [4];
  int j;
  vector<Point,_std::allocator<Point>_> vertices;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  string local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  int local_304;
  Point PStack_300;
  int i_1;
  string local_2f8;
  Point local_2d8;
  string local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  Point local_230;
  string local_228;
  Point local_208;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_2c;
  string *psStack_28;
  int i;
  string *json_local;
  RTree_node *pRStack_18;
  int level_local;
  RTree_node *node_local;
  RTree *this_local;
  
  psStack_28 = json;
  json_local._4_4_ = level;
  pRStack_18 = node;
  node_local = (RTree_node *)this;
  if ((node->is_leaf & 1U) == 0) {
    for (local_2c = 0; local_2c < pRStack_18->elements; local_2c = local_2c + 1) {
      std::__cxx11::string::operator+=((string *)psStack_28,"{");
      std::__cxx11::to_string(&local_90,pRStack_18->at_level);
      std::operator+(&local_70,"\"level\":",&local_90);
      std::operator+(&local_50,&local_70,",\n");
      std::__cxx11::string::operator+=((string *)psStack_28,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::to_string(&local_100,0);
      std::operator+(&local_e0,"\"is_leaf\":",&local_100);
      std::operator+(&local_c0,&local_e0,",\n");
      std::__cxx11::string::operator+=((string *)psStack_28,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      pvVar2 = std::vector<d_internal_node,_std::allocator<d_internal_node>_>::operator[]
                         (&pRStack_18->data_internal_node,(long)local_2c);
      iVar1 = Polygon::get_key(pvVar2->region);
      std::__cxx11::to_string(&local_160,iVar1);
      std::operator+(&local_140,"\"key\":",&local_160);
      std::operator+(&local_120,&local_140,",\n");
      std::__cxx11::string::operator+=((string *)psStack_28,(string *)&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::operator+=((string *)psStack_28,"\"elements\":[");
      pvVar2 = std::vector<d_internal_node,_std::allocator<d_internal_node>_>::operator[]
                         (&pRStack_18->data_internal_node,(long)local_2c);
      local_208 = Polygon::get_Pmin(pvVar2->region);
      iVar1 = Point::get_X(&local_208);
      std::__cxx11::to_string(&local_200,iVar1);
      std::operator+(&local_1e0,"[",&local_200);
      std::operator+(&local_1c0,&local_1e0,",");
      pvVar2 = std::vector<d_internal_node,_std::allocator<d_internal_node>_>::operator[]
                         (&pRStack_18->data_internal_node,(long)local_2c);
      local_230 = Polygon::get_Pmin(pvVar2->region);
      iVar1 = Point::get_Y(&local_230);
      std::__cxx11::to_string(&local_228,iVar1);
      std::operator+(&local_1a0,&local_1c0,&local_228);
      std::operator+(&local_180,&local_1a0,"],\n");
      std::__cxx11::string::operator+=((string *)psStack_28,(string *)&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_200);
      pvVar2 = std::vector<d_internal_node,_std::allocator<d_internal_node>_>::operator[]
                         (&pRStack_18->data_internal_node,(long)local_2c);
      local_2d8 = Polygon::get_Pmax(pvVar2->region);
      iVar1 = Point::get_X(&local_2d8);
      std::__cxx11::to_string(&local_2d0,iVar1);
      std::operator+(&local_2b0,"[",&local_2d0);
      std::operator+(&local_290,&local_2b0,",");
      pvVar2 = std::vector<d_internal_node,_std::allocator<d_internal_node>_>::operator[]
                         (&pRStack_18->data_internal_node,(long)local_2c);
      PStack_300 = Polygon::get_Pmax(pvVar2->region);
      iVar1 = Point::get_Y(&stack0xfffffffffffffd00);
      std::__cxx11::to_string(&local_2f8,iVar1);
      std::operator+(&local_270,&local_290,&local_2f8);
      std::operator+(&local_250,&local_270,"]\n");
      std::__cxx11::string::operator+=((string *)psStack_28,(string *)&local_250);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::operator+=((string *)psStack_28,"]}");
      std::__cxx11::string::operator+=((string *)psStack_28,",");
      pvVar2 = std::vector<d_internal_node,_std::allocator<d_internal_node>_>::operator[]
                         (&pRStack_18->data_internal_node,(long)local_2c);
      showAll_values_JSON(this,pvVar2->child,json_local._4_4_ + 1,psStack_28);
    }
  }
  else {
    for (local_304 = 0; local_304 < pRStack_18->elements; local_304 = local_304 + 1) {
      std::__cxx11::string::operator+=((string *)psStack_28,"{");
      std::__cxx11::to_string(&local_368,pRStack_18->at_level);
      std::operator+(&local_348,"\"level\":",&local_368);
      std::operator+(&local_328,&local_348,",\n");
      std::__cxx11::string::operator+=((string *)psStack_28,(string *)&local_328);
      std::__cxx11::string::~string((string *)&local_328);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_368);
      __return_storage_ptr__ =
           &vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::to_string((string *)__return_storage_ptr__,1);
      std::operator+(&local_3a8,"\"is_leaf\":",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__);
      std::operator+(&local_388,&local_3a8,",\n");
      std::__cxx11::string::operator+=((string *)psStack_28,(string *)&local_388);
      std::__cxx11::string::~string((string *)&local_388);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::__cxx11::string::~string
                ((string *)
                 &vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::operator+=((string *)psStack_28,"\"elements\":[");
      pvVar3 = std::vector<d_leaf,_std::allocator<d_leaf>_>::operator[]
                         (&pRStack_18->data_leafs,(long)local_304);
      Polygon::get_vertices((vector<Point,_std::allocator<Point>_> *)local_3e0,pvVar3->polygon);
      std::__cxx11::string::operator+=((string *)psStack_28,"[");
      local_3e4 = 0;
      while( true ) {
        uVar4 = (ulong)local_3e4;
        pvVar3 = std::vector<d_leaf,_std::allocator<d_leaf>_>::operator[]
                           (&pRStack_18->data_leafs,(long)local_304);
        Polygon::get_vertices(&local_400,pvVar3->polygon);
        sVar5 = std::vector<Point,_std::allocator<Point>_>::size(&local_400);
        std::vector<Point,_std::allocator<Point>_>::~vector(&local_400);
        if (sVar5 <= uVar4) break;
        pvVar6 = std::vector<Point,_std::allocator<Point>_>::operator[]
                           ((vector<Point,_std::allocator<Point>_> *)local_3e0,(long)local_3e4);
        iVar1 = Point::get_X(pvVar6);
        std::__cxx11::to_string(&local_4a0,iVar1);
        std::operator+(&local_480,"[",&local_4a0);
        std::operator+(&local_460,&local_480,",");
        pvVar6 = std::vector<Point,_std::allocator<Point>_>::operator[]
                           ((vector<Point,_std::allocator<Point>_> *)local_3e0,(long)local_3e4);
        iVar1 = Point::get_Y(pvVar6);
        std::__cxx11::to_string(&local_4c0,iVar1);
        std::operator+(&local_440,&local_460,&local_4c0);
        std::operator+(&local_420,&local_440,"]");
        std::__cxx11::string::operator+=((string *)psStack_28,(string *)&local_420);
        std::__cxx11::string::~string((string *)&local_420);
        std::__cxx11::string::~string((string *)&local_440);
        std::__cxx11::string::~string((string *)&local_4c0);
        std::__cxx11::string::~string((string *)&local_460);
        std::__cxx11::string::~string((string *)&local_480);
        std::__cxx11::string::~string((string *)&local_4a0);
        iVar1 = local_3e4 + 1;
        pvVar3 = std::vector<d_leaf,_std::allocator<d_leaf>_>::operator[]
                           (&pRStack_18->data_leafs,(long)local_304);
        Polygon::get_vertices(&local_4d8,pvVar3->polygon);
        sVar5 = std::vector<Point,_std::allocator<Point>_>::size(&local_4d8);
        std::vector<Point,_std::allocator<Point>_>::~vector(&local_4d8);
        if ((long)iVar1 != sVar5) {
          std::__cxx11::string::operator+=((string *)psStack_28,",\n");
        }
        local_3e4 = local_3e4 + 1;
      }
      std::__cxx11::string::operator+=((string *)psStack_28,"]");
      std::__cxx11::string::operator+=((string *)psStack_28,"]}");
      std::__cxx11::string::operator+=((string *)psStack_28,",");
      std::vector<Point,_std::allocator<Point>_>::~vector
                ((vector<Point,_std::allocator<Point>_> *)local_3e0);
    }
  }
  return;
}

Assistant:

void RTree::showAll_values_JSON(RTree_node *node, int level, std::string &json)
{
    if(!node->is_leaf)
    {
        for(int i=0; i<node->elements; i++)
        {
            
            json +="{";
            json += "\"level\":"+std::to_string(node->at_level)+",\n";
            json += "\"is_leaf\":"+std::to_string(0)+",\n";
            json += "\"key\":"+std::to_string(node->data_internal_node[i].region->get_key())+",\n";
            json += "\"elements\":[";
            json +="["+std::to_string(node->data_internal_node[i].region->get_Pmin().get_X())+","+std::to_string(node->data_internal_node[i].region->get_Pmin().get_Y())+"],\n";
            json +="["+std::to_string(node->data_internal_node[i].region->get_Pmax().get_X())+","+std::to_string(node->data_internal_node[i].region->get_Pmax().get_Y())+"]\n";
            json +="]}";
            json +=",";
            showAll_values_JSON(node->data_internal_node[i].child, level+1, json);

        }
    }
    else
    {
        for(int i=0; i<node->elements; i++)
        {
            json +="{";
            json += "\"level\":"+std::to_string(node->at_level)+",\n";
            json += "\"is_leaf\":"+std::to_string(1)+",\n";
            json += "\"elements\":[";
            std::vector<Point> vertices = node->data_leafs[i].polygon->get_vertices();
            json += "[";
            for(int j=0; j<node->data_leafs[i].polygon->get_vertices().size(); j++)
            {
            json +="["+std::to_string(vertices[j].get_X())+","+std::to_string(vertices[j].get_Y())+"]";
            if(j+1 != node->data_leafs[i].polygon->get_vertices().size())
                    json += ",\n";
            }
            json += "]";
            json +="]}";
            json +=",";
        }
    }
}